

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void Catch::applyFilenamesAsTags(IConfig *config)

{
  size_t *__return_storage_ptr__;
  int iVar1;
  IRegistryHub *pIVar2;
  undefined4 extraout_var;
  long *plVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  local_b8 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tags;
  undefined1 local_78 [16];
  undefined1 local_68 [8];
  string filename;
  
  pIVar2 = getRegistryHub();
  iVar1 = (*pIVar2->_vptr_IRegistryHub[3])(pIVar2);
  plVar3 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x18))
                             ((long *)CONCAT44(extraout_var,iVar1),config);
  filename.field_2._8_8_ = *plVar3;
  if (plVar3[1] != filename.field_2._8_8_) {
    lVar5 = 0;
    uVar6 = 0;
    do {
      lVar4 = filename.field_2._8_8_ + lVar5;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_b8,
                 (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(lVar4 + 0x60));
      local_68 = (undefined1  [8])&filename._M_string_length;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_68,*(long *)(lVar4 + 0xe0),
                 *(long *)(lVar4 + 0xe8) + *(long *)(lVar4 + 0xe0));
      lVar4 = std::__cxx11::string::find_last_of((char *)local_68,0x166917,0xffffffffffffffff);
      __return_storage_ptr__ = &tags._M_t._M_impl.super__Rb_tree_header._M_node_count;
      if (lVar4 != -1) {
        std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)local_68);
        std::__cxx11::string::operator=((string *)local_68,(string *)__return_storage_ptr__);
        if ((undefined1 *)tags._M_t._M_impl.super__Rb_tree_header._M_node_count != local_78) {
          operator_delete((void *)tags._M_t._M_impl.super__Rb_tree_header._M_node_count);
        }
      }
      lVar4 = std::__cxx11::string::find_last_of((char *)local_68,0x167e1d,0xffffffffffffffff);
      if (lVar4 != -1) {
        std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)local_68);
        std::__cxx11::string::operator=((string *)local_68,(string *)__return_storage_ptr__);
        if ((undefined1 *)tags._M_t._M_impl.super__Rb_tree_header._M_node_count != local_78) {
          operator_delete((void *)tags._M_t._M_impl.super__Rb_tree_header._M_node_count);
        }
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __return_storage_ptr__,"#",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                (local_b8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          __return_storage_ptr__);
      if ((undefined1 *)tags._M_t._M_impl.super__Rb_tree_header._M_node_count != local_78) {
        operator_delete((void *)tags._M_t._M_impl.super__Rb_tree_header._M_node_count);
      }
      setTags((TestCaseInfo *)(filename.field_2._8_8_ + lVar5),
              (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_b8);
      if (local_68 != (undefined1  [8])&filename._M_string_length) {
        operator_delete((void *)local_68);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_b8);
      uVar6 = uVar6 + 1;
      filename.field_2._8_8_ = *plVar3;
      lVar5 = lVar5 + 0x118;
    } while (uVar6 < (ulong)((plVar3[1] - filename.field_2._8_8_ >> 3) * -0x5075075075075075));
  }
  return;
}

Assistant:

void applyFilenamesAsTags(IConfig const& config) {
		std::vector<TestCase> const& tests = getAllTestCasesSorted(config);
		for (std::size_t i = 0; i < tests.size(); ++i) {
			TestCase& test = const_cast<TestCase&>(tests[i]);
			std::set<std::string> tags = test.tags;

			std::string filename = test.lineInfo.file;
			std::string::size_type lastSlash = filename.find_last_of("\\/");
			if (lastSlash != std::string::npos)
				filename = filename.substr(lastSlash + 1);

			std::string::size_type lastDot = filename.find_last_of(".");
			if (lastDot != std::string::npos)
				filename = filename.substr(0, lastDot);

			tags.insert("#" + filename);
			setTags(test, tags);
		}
	}